

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_messenger.cpp
# Opt level: O2

void __thiscall cppcms::impl::messenger::messenger(messenger *this,string *ip,int port)

{
  socklen_t in_ECX;
  string local_40 [32];
  
  booster::aio::stream_socket::stream_socket(&this->socket_);
  (this->ip_)._M_dataplus._M_p = (pointer)&(this->ip_).field_2;
  (this->ip_)._M_string_length = 0;
  (this->ip_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string(local_40,(string *)ip);
  connect(this,(int)local_40,(sockaddr *)(ulong)(uint)port,in_ECX);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

messenger::messenger(std::string ip,int port) :
		socket_()
{
	connect(ip,port);
}